

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_anomaly_test.cc
# Opt level: O2

int main(void)

{
  write_failure_test();
  read_failure_test();
  handle_busy_test();
  read_old_file();
  corrupted_header_correct_superblock_test();
  compaction_failure_hangs_rollback_test();
  return 0;
}

Assistant:

int main(){

    /**
     * Commented out this test for now; it copies consecutive document blocks
     * to other file but they are written in different BID compared to the source
     * file, so that meta section at the end of each document block points to wrong
     * block and consequently documents cannot be read correctly.
     */
    //copy_file_range_test();
    write_failure_test();
    read_failure_test();
    handle_busy_test();
    read_old_file();
    corrupted_header_correct_superblock_test();
    compaction_failure_hangs_rollback_test();

    return 0;
}